

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Emu.cpp
# Opt level: O0

blargg_err_t __thiscall Hes_Emu::run_clocks(Hes_Emu *this,blip_time_t *duration_,int param_3)

{
  int present;
  bool bVar1;
  blip_time_t in_EDX;
  Hes_Apu *in_RSI;
  Hes_Emu *in_RDI;
  blip_time_t duration;
  hes_time_t in_stack_0000019c;
  Hes_Cpu *in_stack_000001a0;
  
  present = *(int *)in_RSI->oscs[0].wave;
  bVar1 = Hes_Cpu::run(in_stack_000001a0,in_stack_0000019c);
  if (bVar1) {
    Gme_File::set_warning((Gme_File *)in_RDI,"Emulation error (illegal instruction)");
  }
  run_until(in_RDI,present);
  (in_RDI->timer).last_time = (in_RDI->timer).last_time - present;
  (in_RDI->vdp).next_vbl = (in_RDI->vdp).next_vbl - present;
  Hes_Cpu::end_frame(&in_RDI->super_Hes_Cpu,present);
  adjust_time(&(in_RDI->irq).timer,present);
  adjust_time(&(in_RDI->irq).vdp,present);
  Hes_Apu::end_frame(in_RSI,in_EDX);
  return (blargg_err_t)0x0;
}

Assistant:

blargg_err_t Hes_Emu::run_clocks( blip_time_t& duration_, int )
{
	blip_time_t const duration = duration_; // cache
	
	if ( cpu::run( duration ) )
		set_warning( "Emulation error (illegal instruction)" );
	
	check( time() >= duration );
	//check( time() - duration < 20 ); // Txx instruction could cause going way over
	
	run_until( duration );
	
	// end time frame
	timer.last_time -= duration;
	vdp.next_vbl    -= duration;
	#if GME_FRAME_HOOK_DEFINED
		last_frame_hook -= duration;
	#endif
	cpu::end_frame( duration );
	::adjust_time( irq.timer, duration );
	::adjust_time( irq.vdp,   duration );
	apu.end_frame( duration );
	
	return 0;
}